

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O0

self_ * __thiscall standards::exp_number<double>::operator*=(exp_number<double> *this,self_ *rhs)

{
  self_ *psVar1;
  double *in_RSI;
  int in_EDI;
  undefined4 in_register_0000003c;
  double extraout_XMM0_Qa;
  
  psVar1 = (self_ *)CONCAT44(in_register_0000003c,in_EDI);
  psVar1->log_ = *in_RSI + psVar1->log_;
  psVar1->sign_ = *(int *)(in_RSI + 1) * psVar1->sign_;
  std::abs(in_EDI);
  if (extraout_XMM0_Qa < 1e-10) {
    psVar1->log_ = 0.0;
  }
  return psVar1;
}

Assistant:

self_& operator*=(self_ const& rhs) {
    log_ += rhs.log_;
    sign_ *= rhs.sign_;
    if (std::abs(log_/rhs.log_) < 1.0e-10) log_ = 0;
    return *this;
  }